

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::edit_distance::anon_unknown_1::Hunk::FlushEdits(Hunk *this)

{
  int in_ECX;
  long in_RDI;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  iterator local_28;
  _List_const_iterator<std::pair<char,_const_char_*>_> local_20;
  iterator local_18;
  _List_const_iterator<std::pair<char,_const_char_*>_> local_10 [2];
  
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::end
                 ((list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                   *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  std::_List_const_iterator<std::pair<char,_const_char_*>_>::_List_const_iterator
            (local_10,&local_18);
  std::__cxx11::list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
  ::splice((list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *)
           (in_RDI + 0x28),(int)local_10[0]._M_node,(__off64_t *)(in_RDI + 0x58),in_ECX,in_R8,in_R9,
           in_stack_ffffffffffffffb8);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::end
                 ((list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                   *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  std::_List_const_iterator<std::pair<char,_const_char_*>_>::_List_const_iterator
            (&local_20,&local_28);
  std::__cxx11::list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
  ::splice((list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *)
           (in_RDI + 0x28),(int)local_20._M_node,(__off64_t *)(in_RDI + 0x40),in_ECX,in_R8,in_R9,
           in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void FlushEdits() {
    hunk_.splice(hunk_.end(), hunk_removes_);
    hunk_.splice(hunk_.end(), hunk_adds_);
  }